

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QRect __thiscall QDockAreaLayoutInfo::itemRect(QDockAreaLayoutInfo *this,QList<int> *path)

{
  int index;
  QDockAreaLayoutInfo *this_00;
  long in_FS_OFFSET;
  QRect QVar1;
  QArrayDataPointer<int> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  index = *(path->d).ptr;
  if ((ulong)(path->d).size < 2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QVar1 = itemRect(this,index,false);
      return QVar1;
    }
  }
  else {
    this_00 = (this->item_list).d.ptr[index].subinfo;
    QList<int>::mid((QList<int> *)&QStack_38,path,1,-1);
    QVar1 = itemRect(this_00,(QList<int> *)&QStack_38);
    QArrayDataPointer<int>::~QArrayDataPointer(&QStack_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return QVar1;
    }
  }
  __stack_chk_fail();
}

Assistant:

QRect QDockAreaLayoutInfo::itemRect(const QList<int> &path) const
{
    Q_ASSERT(!path.isEmpty());

    const int index = path.first();
    if (path.size() > 1) {
        const QDockAreaLayoutItem &item = item_list.at(index);
        Q_ASSERT(item.subinfo != nullptr);
        return item.subinfo->itemRect(path.mid(1));
    }

    return itemRect(index);
}